

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_vector.h
# Opt level: O0

SortedVector * __thiscall
wasm::SortedVector::merge
          (SortedVector *__return_storage_ptr__,SortedVector *this,SortedVector *other)

{
  uint uVar1;
  uint uVar2;
  value_type vVar3;
  size_type sVar4;
  size_type sVar5;
  const_reference pvVar6;
  reference pvVar7;
  bool bVar8;
  value_type right;
  value_type left;
  Index t;
  Index j;
  Index i;
  SortedVector *other_local;
  SortedVector *this_local;
  SortedVector *ret;
  
  SortedVector(__return_storage_ptr__);
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
  sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    (&other->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
             sVar4 + sVar5);
  t = 0;
  left = 0;
  right = 0;
  while( true ) {
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
    bVar8 = false;
    if (t < sVar4) {
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        (&other->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
      bVar8 = left < sVar4;
    }
    if (!bVar8) break;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,(ulong)t);
    uVar1 = *pvVar6;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&other->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
                        (ulong)left);
    uVar2 = *pvVar6;
    if (uVar1 < uVar2) {
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&__return_storage_ptr__->
                           super_vector<unsigned_int,_std::allocator<unsigned_int>_>,(ulong)right);
      *pvVar7 = uVar1;
      t = t + 1;
    }
    else {
      if (uVar2 < uVar1) {
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&__return_storage_ptr__->
                             super_vector<unsigned_int,_std::allocator<unsigned_int>_>,(ulong)right)
        ;
        *pvVar7 = uVar2;
      }
      else {
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&__return_storage_ptr__->
                             super_vector<unsigned_int,_std::allocator<unsigned_int>_>,(ulong)right)
        ;
        *pvVar7 = uVar1;
        t = t + 1;
      }
      left = left + 1;
    }
    right = right + 1;
  }
  for (; sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>),
      t < sVar4; t = t + 1) {
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,(ulong)t);
    vVar3 = *pvVar6;
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&__return_storage_ptr__->
                         super_vector<unsigned_int,_std::allocator<unsigned_int>_>,(ulong)right);
    *pvVar7 = vVar3;
    right = right + 1;
  }
  for (; sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           (&other->super_vector<unsigned_int,_std::allocator<unsigned_int>_>),
      left < sVar4; left = left + 1) {
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&other->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
                        (ulong)left);
    vVar3 = *pvVar6;
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&__return_storage_ptr__->
                         super_vector<unsigned_int,_std::allocator<unsigned_int>_>,(ulong)right);
    *pvVar7 = vVar3;
    right = right + 1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
             (ulong)right);
  return __return_storage_ptr__;
}

Assistant:

SortedVector merge(const SortedVector& other) const {
    SortedVector ret;
    ret.resize(size() + other.size());
    Index i = 0, j = 0, t = 0;
    while (i < size() && j < other.size()) {
      auto left = (*this)[i];
      auto right = other[j];
      if (left < right) {
        ret[t++] = left;
        i++;
      } else if (left > right) {
        ret[t++] = right;
        j++;
      } else {
        ret[t++] = left;
        i++;
        j++;
      }
    }
    while (i < size()) {
      ret[t++] = (*this)[i];
      i++;
    }
    while (j < other.size()) {
      ret[t++] = other[j];
      j++;
    }
    ret.resize(t);
    return ret;
  }